

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O1

void __thiscall
ritobin::io::impl_binary_write::BinaryWriter::write<unsigned_long>
          (BinaryWriter *this,unsigned_long value)

{
  char buffer [8];
  unsigned_long local_8;
  
  local_8 = value;
  std::vector<char,std::allocator<char>>::_M_range_insert<char*>
            ((vector<char,std::allocator<char>> *)this->buffer_,
             *(undefined8 *)((vector<char,std::allocator<char>> *)this->buffer_ + 8),&local_8);
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            char buffer[sizeof(value)];
            memcpy(buffer, &value, sizeof(value));
            buffer_.insert(buffer_.end(), buffer, buffer + sizeof(buffer));
        }